

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  long lVar1;
  int iVar2;
  int iVar3;
  xmlChar *str1;
  xmlNodePtr node_00;
  byte *str1_00;
  xmlHashTablePtr pxVar4;
  ulong uVar5;
  xmlAttrPtr attr;
  xmlSchemaTypePtr value;
  int *piVar6;
  xmlSchemaWildcardNsPtr pxVar7;
  undefined4 uVar8;
  int iVar9;
  char *in_R8;
  int *piVar10;
  long lVar11;
  xmlChar *in_stack_ffffffffffffffa8;
  xmlChar *in_stack_ffffffffffffffb0;
  xmlSchemaParserCtxtPtr pxVar12;
  xmlSchemaWildcardNsPtr local_48;
  
  str1 = xmlSchemaGetProp(ctxt,(xmlNodePtr)wildc,"processContents");
  iVar9 = 0;
  uVar8 = 3;
  if ((str1 != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(str1,(xmlChar *)"strict"), iVar2 == 0)) {
    iVar2 = xmlStrEqual(str1,(xmlChar *)"skip");
    if (iVar2 == 0) {
      iVar2 = xmlStrEqual(str1,(xmlChar *)"lax");
      if (iVar2 == 0) {
        in_R8 = "(strict | skip | lax)";
        iVar9 = 0xbdd;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)wildc,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(strict | skip | lax)",(char *)str1,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
      }
      else {
        uVar8 = 2;
      }
    }
    else {
      uVar8 = 1;
    }
  }
  *(undefined4 *)&schema->annot = uVar8;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)wildc,"namespace");
  str1_00 = xmlSchemaGetNodeContent(ctxt,node_00);
  iVar2 = -1;
  if (str1_00 != (byte *)0x0) {
    if ((node_00 == (xmlNodePtr)0x0) ||
       (iVar3 = xmlStrEqual(str1_00,(xmlChar *)"##any"), iVar3 != 0)) {
      *(undefined4 *)((long)&schema->annot + 4) = 1;
      iVar2 = iVar9;
    }
    else {
      iVar3 = xmlStrEqual(str1_00,(xmlChar *)"##other");
      if (iVar3 == 0) {
        piVar10 = &schema->flags;
        local_48 = (xmlSchemaWildcardNsPtr)0x0;
        do {
          while ((uVar5 = (ulong)*str1_00, uVar5 < 0x21 &&
                 ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
            str1_00 = str1_00 + 1;
          }
          lVar11 = 0;
          while ((0x20 < (byte)uVar5 || ((0x100002601U >> (uVar5 & 0x3f) & 1) == 0))) {
            lVar1 = lVar11 + 1;
            lVar11 = lVar11 + 1;
            uVar5 = (ulong)str1_00[lVar1];
          }
          if (lVar11 == 0) {
            return iVar9;
          }
          attr = (xmlAttrPtr)xmlStrndup(str1_00,(int)lVar11);
          iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##other");
          pxVar7 = local_48;
          if ((iVar2 == 0) && (iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##any"), iVar2 == 0))
          {
            iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##targetNamespace");
            piVar6 = piVar10;
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##local");
              if (iVar2 == 0) {
                value = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                pxVar12 = ctxt;
                xmlSchemaPValAttrNodeValue
                          (ctxt,(xmlSchemaBasicItemPtr)node_00,attr,(xmlChar *)value,
                           (xmlSchemaTypePtr)in_R8);
                pxVar4 = (xmlHashTablePtr)xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
                ctxt = pxVar12;
              }
              else {
                pxVar4 = (xmlHashTablePtr)0x0;
              }
            }
            else {
              pxVar4 = (xmlHashTablePtr)ctxt->targetNamespace;
            }
            do {
              piVar6 = *(int **)piVar6;
              if (piVar6 == (int *)0x0) {
                pxVar7 = xmlSchemaNewWildcardNsConstraint(ctxt);
                if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) {
                  (*xmlFree)(attr);
                  return -1;
                }
                pxVar7->value = (xmlChar *)pxVar4;
                pxVar7->next = (_xmlSchemaWildcardNs *)0x0;
                if (*(long *)piVar10 == 0) {
                  *(xmlSchemaWildcardNsPtr *)piVar10 = pxVar7;
                }
                else if (local_48 != (xmlSchemaWildcardNsPtr)0x0) {
                  local_48->next = pxVar7;
                }
                break;
              }
            } while (pxVar4 != *(xmlHashTablePtr *)(piVar6 + 2));
          }
          else {
            iVar9 = 0x700;
            in_R8 = "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))";
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)node_00,
                       (xmlNodePtr)0x0,
                       (xmlSchemaTypePtr)
                       "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                       (char *)attr,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                       (xmlChar *)ctxt);
          }
          local_48 = pxVar7;
          str1_00 = str1_00 + lVar11;
          (*xmlFree)(attr);
          iVar2 = iVar9;
        } while (*str1_00 != 0);
      }
      else {
        pxVar4 = (xmlHashTablePtr)xmlSchemaNewWildcardNsConstraint(ctxt);
        schema->typeDecl = pxVar4;
        if (pxVar4 != (xmlHashTablePtr)0x0) {
          *(xmlChar **)&pxVar4->size = ctxt->targetNamespace;
          iVar2 = iVar9;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (ns == NULL)
        return (-1);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}